

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::execute(Executor *this,Values *initial)

{
  shared_ptr<Node> sVar1;
  SharedPtr<Node> element;
  SharedPtr<Node> root;
  pointer local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  pointer local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  sVar1 = std::make_shared<Node,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28);
  element.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_38 = local_28;
  _Stack_30._M_pi = _Stack_20._M_pi;
  local_28 = (pointer)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  element.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_38;
  OpenList::addLast(&this->m_openList,element);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  executeBFS(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  return;
}

Assistant:

void Executor::execute(Values initial)
{
    SharedPtr<Node> root = std::make_shared<Node>(std::move(initial));
    m_openList.addLast(std::move(root));

    executeBFS();
}